

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O1

void __thiscall Refal2::CRuleParser::afterVariableType(CRuleParser *this)

{
  TTokenType TVar1;
  bool bVar2;
  code *pcVar3;
  string local_38;
  
  TVar1 = (this->super_CQualifierParser).token.type;
  if (TVar1 == TT_Qualifier) {
    bVar2 = CModuleBuilder::GetNamedQualifier
                      ((CModuleBuilder *)this,&(this->super_CQualifierParser).token,&this->qualifier
                      );
    if (!bVar2) {
      if ((this->super_CQualifierParser).super_CParsingElementState.state == PES_NotFinished) {
        (this->super_CQualifierParser).super_CParsingElementState.state = PES_Wrong;
        return;
      }
      __assert_fail("!IsFinished()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/include/QualifierParser.h"
                    ,0x22,"void Refal2::CParsingElementState::SetFinished(bool)");
    }
    pcVar3 = afterVariableQualifier;
  }
  else {
    if (TVar1 != TT_LeftParen) {
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"unexpected token after variable type","");
      error(this,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return;
      }
      operator_delete(local_38._M_dataplus._M_p);
      return;
    }
    CQualifierParser::StartQualifer(&this->super_CQualifierParser);
    pcVar3 = variableQualifier;
  }
  this->state = (TState)pcVar3;
  *(undefined8 *)&this->field_0x1e80 = 0;
  return;
}

Assistant:

void CRuleParser::afterVariableType()
{
	if( token.type == TT_LeftParen ) {
		CQualifierParser::StartQualifer();
		state = &CRuleParser::variableQualifier;
	} else if( token.type == TT_Qualifier ) {
		if( CModuleBuilder::GetNamedQualifier( token, qualifier ) ) {
			state = &CRuleParser::afterVariableQualifier;
		} else {
			SetWrong();
		}
	} else {
		error( "unexpected token after variable type" );
	}
}